

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

Vec_Wrd_t * Abc_NtkShareSuperAnd(Abc_Obj_t *pObj,int *pCounter)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *p;
  Vec_Wrd_t *p_00;
  word wVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p_01;
  Abc_Obj_t *pAVar5;
  word wVar6;
  int local_60;
  int local_5c;
  int k;
  int i;
  word NumNext;
  word Num;
  Vec_Wrd_t *vSuper;
  Abc_Obj_t *pRoot;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Abc_Ntk_t *pNtk;
  int *pCounter_local;
  Abc_Obj_t *pObj_local;
  
  p = Abc_ObjNtk(pObj);
  vSuper = (Vec_Wrd_t *)0x0;
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                  ,0xa6,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  p_00 = Vec_WrdAlloc(10);
  iVar1 = Abc_ObjLevel(pObj);
  iVar2 = Abc_ObjToLit(pObj);
  wVar3 = Abc_NtkSharePack(iVar1,iVar2);
  Vec_WrdPush(p_00,wVar3);
  while (iVar1 = Vec_WrdSize(p_00), 0 < iVar1) {
    NumNext = Vec_WrdEntry(p_00,0);
    for (local_5c = 1; iVar1 = Vec_WrdSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
      wVar3 = Vec_WrdEntry(p_00,local_5c);
      if (wVar3 <= NumNext) {
        __assert_fail("Num < NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xb0,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
      NumNext = wVar3;
    }
    local_5c = Vec_WrdSize(p_00);
    do {
      local_5c = local_5c + -1;
      if (local_5c < 0) goto LAB_0030ca5c;
      wVar3 = Vec_WrdEntry(p_00,local_5c);
      iVar1 = Abc_NtkShareUnpackId(wVar3);
      vSuper = (Vec_Wrd_t *)Abc_ObjFromLit(p,iVar1);
      iVar1 = Abc_ObjIsComplement((Abc_Obj_t *)vSuper);
    } while ((iVar1 != 0) || (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)vSuper), iVar1 == 0));
    Vec_WrdRemove(p_00,wVar3);
LAB_0030ca5c:
    if (local_5c == -1) break;
    iVar1 = Abc_ObjIsNode((Abc_Obj_t *)vSuper);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pRoot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                    ,0xbf,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
    }
    pAVar4 = Abc_ObjChild0((Abc_Obj_t *)vSuper);
    p_01 = Abc_ObjChild1((Abc_Obj_t *)vSuper);
    pAVar5 = Abc_ObjRegular(pAVar4);
    iVar1 = Abc_ObjIsNode(pAVar5);
    if (iVar1 == 0) {
      pAVar5 = Abc_ObjRegular(pAVar4);
      iVar1 = Abc_ObjIsCi(pAVar5);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xc3,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
    }
    pAVar5 = Abc_ObjRegular(p_01);
    iVar1 = Abc_ObjIsNode(pAVar5);
    if (iVar1 == 0) {
      pAVar5 = Abc_ObjRegular(p_01);
      iVar1 = Abc_ObjIsCi(pAVar5);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xc4,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
    }
    pAVar5 = Abc_ObjRegular(pAVar4);
    iVar1 = Abc_ObjLevel(pAVar5);
    iVar2 = Abc_ObjToLit(pAVar4);
    wVar3 = Abc_NtkSharePack(iVar1,iVar2);
    Vec_WrdPushOrder(p_00,wVar3);
    pAVar4 = Abc_ObjRegular(p_01);
    iVar1 = Abc_ObjLevel(pAVar4);
    iVar2 = Abc_ObjToLit(p_01);
    wVar3 = Abc_NtkSharePack(iVar1,iVar2);
    Vec_WrdPushOrder(p_00,wVar3);
    *pCounter = *pCounter + 1;
    local_60 = 0;
    for (local_5c = 0; iVar1 = Vec_WrdSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
      wVar3 = Vec_WrdEntry(p_00,local_5c);
      iVar1 = Vec_WrdSize(p_00);
      if (local_5c + 1 == iVar1) {
        Vec_WrdWriteEntry(p_00,local_60,wVar3);
        local_60 = local_60 + 1;
        break;
      }
      wVar6 = Vec_WrdEntry(p_00,local_5c + 1);
      if (wVar6 < wVar3) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                      ,0xd2,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
      if ((wVar3 + 1 == wVar6) && ((wVar6 & 1) != 0)) {
        Vec_WrdClear(p_00);
        return p_00;
      }
      if (wVar3 < wVar6) {
        Vec_WrdWriteEntry(p_00,local_60,wVar3);
        local_60 = local_60 + 1;
      }
    }
    Vec_WrdShrink(p_00,local_60);
  }
  for (local_5c = 0; iVar1 = Vec_WrdSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    wVar3 = Vec_WrdEntry(p_00,local_5c);
    iVar1 = Abc_NtkShareUnpackId(wVar3);
    Vec_WrdWriteEntry(p_00,local_5c,(long)iVar1);
  }
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperAnd( Abc_Obj_t * pObj, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k;
    assert( !Abc_ObjIsComplement(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjToLit(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract AND gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_ObjFromLit( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( !Abc_ObjIsComplement(pRoot) && Abc_ObjIsNode(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        assert( Abc_ObjIsNode(pRoot) );
        // extract
        pObj0 = Abc_ObjChild0(pRoot);
        pObj1 = Abc_ObjChild1(pRoot);
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0)) );
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj0)), Abc_ObjToLit(pObj0)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj1)), Abc_ObjToLit(pObj1)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num + 1 == NumNext && (NumNext & 1) ) // pos_lit & neg_lit = 0
            {
                Vec_WrdClear( vSuper );
                return vSuper;
            }
            if ( Num < NumNext )
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}